

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFixtureTests.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6fa07::FakeTestStageBuilder::FakeTestStageBuilder(FakeTestStageBuilder *this)

{
  FakeTestStageBuilder *this_local;
  
  ut11::detail::TestStageBuilder::TestStageBuilder(&this->super_TestStageBuilder);
  (this->super_TestStageBuilder)._vptr_TestStageBuilder =
       (_func_int **)&PTR__FakeTestStageBuilder_00611bc8;
  ut11::Mock<void_(ut11::detail::TestStep)>::Mock(&this->mockPushGiven);
  ut11::Mock<void_(ut11::detail::TestStep)>::Mock(&this->mockPushWhen);
  ut11::Mock<void_(ut11::detail::TestStep)>::Mock(&this->mockPushThen);
  ut11::Mock<void_(ut11::detail::TestStep)>::Mock(&this->mockPushFinally);
  ut11::
  Mock<std::vector<std::shared_ptr<ut11::detail::TestStage>,_std::allocator<std::shared_ptr<ut11::detail::TestStage>_>_>_()>
  ::Mock(&this->mockBuild);
  return;
}

Assistant:

class FakeTestStageBuilder : public ut11::detail::TestStageBuilder
	{
	public:
		virtual ~FakeTestStageBuilder() { }

		MockAction(PushGiven, ut11::detail::TestStep)
		MockAction(PushWhen, ut11::detail::TestStep)
		MockAction(PushThen, ut11::detail::TestStep)
		MockAction(PushFinally, ut11::detail::TestStep)
		MockFunction(std::vector< std::shared_ptr<ut11::detail::TestStage> >, Build)
	};

	class FakeOutput : public ut11::out::Output
	{
	public:
		virtual ~FakeOutput() { }

		MockAction(Begin)
		MockAction(Finish, std::size_t, std::size_t)

		MockAction(BeginFixture, std::string)
		MockAction(EndFixture, std::string)

		MockAction(BeginTest)
		MockAction(EndTest)

		MockAction(BeginGiven, std::string)
		MockAction(EndGiven, std::string)

		MockAction(BeginWhen, std::string)
		MockAction(EndWhen, std::string)

		MockAction(BeginThen, std::string)
		MockAction(EndThen, std::string)

		MockAction(BeginFinally, std::string)
		MockAction(EndFinally, std::string)

		MockAction(OnError, std::size_t, std::string, std::string)
		MockAction(OnUnknownError)

		ut11::Mock<void (std::exception)> mockOnError1;
		virtual void OnError(const std::exception& ex) { mockOnError1(ex); }
	};

	class FakeTestStage : public ut11::detail::TestStage
	{
	private:
		bool m_result;

	public:
		bool WasTestStageRun;

		FakeTestStage(bool result)
			: m_result(result), WasTestStageRun(false)
		{
		}

		virtual ~FakeTestStage() { }


		virtual bool Run(ut11::out::Output&)
		{
			WasTestStageRun = true;
			return m_result;
		}
	};
}

class TestFixtureConstructionTests : public ut11::TestFixture
{
private:
	std::unique_ptr<ut11::TestFixture> m_fixture;
	std::string m_name;

public:
	virtual void Run()
	{
		Given("a fixture constructed with a name", [&]() {

			std::unique_ptr<FakeTestStageBuilder> StageBuilder(new FakeTestStageBuilder);
			m_name = std::string("name");

			m_fixture = std::move(std::unique_ptr<ut11::TestFixture>(new ut11::TestFixture(m_name, std::move(StageBuilder))));
		});
		Then("the name is as expected", [&]() {

			AssertThat(m_fixture->GetName(), ut11::Is::EqualTo(m_name));
		});

		When("setting the name", [&]() {
			m_name = "other_name";
			m_fixture->SetName(m_name);
		});
		Then("the name is as expected", [&]() {

			AssertThat(m_fixture->GetName(), ut11::Is::EqualTo(m_name));
		});
	}